

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O1

void __thiscall
Descriptor_Parse_sh_multi_maximum_Test::~Descriptor_Parse_sh_multi_maximum_Test
          (Descriptor_Parse_sh_multi_maximum_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Descriptor, Parse_sh_multi_maximum) {
  std::string descriptor = "sh(multi(15,02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0,0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c,024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82,03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38,020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1,0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147,0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c,020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9,0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37,0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e,03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b,02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd,0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d,0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2,025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db))";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  std::vector<DescriptorScriptReference> script_list;

  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll());
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "OP_HASH160 3b94abddb86c04958381b48c615a7766bcb3e98f OP_EQUAL");
  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
        "15 02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0 0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c 024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82 03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38 020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1 0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147 0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c 020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9 0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37 0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e 03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b 02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd 0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d 0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2 025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db 15 OP_CHECKMULTISIG");
    EXPECT_TRUE(script_list[0].GetChild().HasReqNum());
    EXPECT_EQ(script_list[0].GetChild().GetReqNum(), 15);
  }
  
  std::string descriptor_err = "sh(multi(15,02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0,0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c,024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82,03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38,020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1,0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147,0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c,020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9,0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37,0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e,03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b,02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd,0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d,0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2,025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db,030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55))";
  try {
    Descriptor::Parse(descriptor_err);
    EXPECT_TRUE(false);
  } catch (const CfdException& except) {
    EXPECT_STREQ("CreateMultisigScript pubkeys array size is over.",
        except.what());
  }
}